

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

optional<std::shared_ptr<ScriptAstNode>_> * __thiscall
Parser::parseScript(optional<std::shared_ptr<ScriptAstNode>_> *__return_storage_ptr__,Parser *this)

{
  int iVar1;
  undefined8 uVar2;
  bool bVar3;
  bool bVar4;
  undefined1 local_88 [24];
  vector<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
  statements;
  ScriptAstNode *local_50;
  optional<std::shared_ptr<StatementAstNode>_> statement;
  
  TokenBuffer::nextToken((TokenBuffer *)local_88);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
  }
  local_88._16_8_ = 0;
  statements.
  super__Vector_base<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  statements.
  super__Vector_base<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bVar4 = false;
  do {
    skipWhiteSpace(this);
    TokenBuffer::currentToken((TokenBuffer *)&local_50);
    iVar1 = *(int *)&local_50[1].super_AstNode._vptr_AstNode;
    if (statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>._M_payload.
        super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
        super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload._M_value.
        super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
                 _M_payload.
                 super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
                 super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload.
                 _M_value.super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    if (iVar1 != 1) {
      parseStatement((optional<std::shared_ptr<StatementAstNode>_> *)&local_50,this);
      bVar3 = true;
      if (statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>._M_payload
          .super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
          super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload._8_1_ ==
          '\x01') {
        std::
        vector<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
        ::push_back((vector<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
                     *)(local_88 + 0x10),(value_type *)&local_50);
        bVar3 = bVar4;
      }
      bVar4 = bVar3;
      if ((statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
           _M_payload.super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>
           .super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload._8_1_ ==
           '\x01') &&
         (statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>._M_payload
          .super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
          super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload._8_1_ = 0,
         statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>._M_payload.
         super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
         super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload._M_value.
         super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
         (element_type *)0x0)) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
                   _M_payload.
                   super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
                   super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload.
                   _M_value.super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
        ;
      }
    }
  } while (iVar1 != 1);
  if (bVar4) {
    (__return_storage_ptr__->super__Optional_base<std::shared_ptr<ScriptAstNode>,_false,_false>).
    _M_payload.super__Optional_payload<std::shared_ptr<ScriptAstNode>,_true,_false,_false>.
    super__Optional_payload_base<std::shared_ptr<ScriptAstNode>_>._M_engaged = false;
  }
  else {
    local_50 = (ScriptAstNode *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<ScriptAstNode,std::allocator<ScriptAstNode>,std::vector<std::shared_ptr<StatementAstNode>,std::allocator<std::shared_ptr<StatementAstNode>>>&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&statement,&local_50,
               (_Sp_alloc_shared_tag<std::allocator<ScriptAstNode>_>)
               &statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
                _M_payload.
                super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
                super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>.field_0x17,
               (vector<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
                *)(local_88 + 0x10));
    uVar2 = statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
            _M_payload.
            super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
            super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload._M_value.
            super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (__return_storage_ptr__->super__Optional_base<std::shared_ptr<ScriptAstNode>,_false,_false>).
    _M_payload.super__Optional_payload<std::shared_ptr<ScriptAstNode>,_true,_false,_false>.
    super__Optional_payload_base<std::shared_ptr<ScriptAstNode>_>._M_payload._M_value.
    super___shared_ptr<ScriptAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_50;
    (__return_storage_ptr__->super__Optional_base<std::shared_ptr<ScriptAstNode>,_false,_false>).
    _M_payload.super__Optional_payload<std::shared_ptr<ScriptAstNode>,_true,_false,_false>.
    super__Optional_payload_base<std::shared_ptr<ScriptAstNode>_>._M_payload._M_value.
    super___shared_ptr<ScriptAstNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>._M_payload.
    super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
    super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload._M_value.
    super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    (__return_storage_ptr__->super__Optional_base<std::shared_ptr<ScriptAstNode>,_false,_false>).
    _M_payload.super__Optional_payload<std::shared_ptr<ScriptAstNode>,_true,_false,_false>.
    super__Optional_payload_base<std::shared_ptr<ScriptAstNode>_>._M_payload._M_value.
    super___shared_ptr<ScriptAstNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2;
    local_50 = (ScriptAstNode *)0x0;
    (__return_storage_ptr__->super__Optional_base<std::shared_ptr<ScriptAstNode>,_false,_false>).
    _M_payload.super__Optional_payload<std::shared_ptr<ScriptAstNode>,_true,_false,_false>.
    super__Optional_payload_base<std::shared_ptr<ScriptAstNode>_>._M_engaged = true;
  }
  std::
  vector<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>::
  ~vector((vector<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
           *)(local_88 + 0x10));
  return __return_storage_ptr__;
}

Assistant:

const std::optional<std::shared_ptr<ScriptAstNode>>
Parser::parseScript() noexcept {

  // we're assuming were before the start of the tape,
  // move the tape to the first token
  this->tokenBuffer->nextToken();

  bool error = false;
  std::vector<std::shared_ptr<StatementAstNode>> statements;

  while (true) {
    this->skipWhiteSpace();

    TokenType t = this->tokenBuffer->currentToken()->tokenType;

    if (t == TokenType::EndOfFile) {
      break;
    }

    auto statement = this->parseStatement();

    if (statement) {
      statements.push_back(statement.value());

    } else {
      error = true;
    }
  }

  if (error) { return std::nullopt; }

  return std::make_shared<ScriptAstNode>(statements);
}